

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itch50_handler.cc
# Opt level: O0

void __thiscall
helix::nasdaq::itch50_handler::process_msg(itch50_handler *this,itch50_order_executed *m)

{
  bool bVar1;
  __uint32_t _Var2;
  trade_sign sign;
  order_book *this_00;
  event *__args;
  pointer ppVar3;
  string *symbol;
  long in_RSI;
  itch50_handler *in_RDI;
  trade t;
  execution result;
  order_book *ob;
  uint64_t timestamp;
  uint64_t quantity;
  iterator it;
  unordered_map<unsigned_long,_helix::order_book,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>_>
  *in_stack_fffffffffffffee8;
  execution *e;
  trade local_78;
  execution local_58;
  order_book *this_01;
  _Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false> local_28;
  ulong local_20;
  _Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false> local_18;
  long local_10;
  
  local_20 = (ulong)*(ushort *)(in_RSI + 1);
  local_10 = in_RSI;
  local_18._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_helix::order_book,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>_>
       ::find(in_stack_fffffffffffffee8,(key_type *)0x141109);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_helix::order_book,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>_>
       ::end(in_stack_fffffffffffffee8);
  bVar1 = std::__detail::operator!=(&local_18,&local_28);
  if (bVar1) {
    _Var2 = __bswap_32(*(__uint32_t *)(local_10 + 0x13));
    this_00 = (order_book *)(ulong)_Var2;
    __args = (event *)itch50_timestamp(0x14117c);
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long,_helix::order_book>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_unsigned_long,_helix::order_book>,_false,_false>
                         *)0x141191);
    this_01 = &ppVar3->second;
    e = &local_58;
    order_book::execute(this_00,(uint64_t)__args,(uint64_t)this_01);
    order_book::set_timestamp(this_01,(uint64_t)__args);
    sign = itch50_trade_sign((side_type)((ulong)in_RDI >> 0x18));
    trade::trade(&local_78,(uint64_t)__args,local_58.price,(uint64_t)this_00,sign);
    symbol = order_book::symbol_abi_cxx11_(this_01);
    sweep_event(in_RDI,e);
    make_event(symbol,(uint64_t)e,this_00,(trade *)local_58.price,
               (event_mask)((ulong)__args >> 0x20));
    std::function<void_(const_helix::event_&)>::operator()
              ((function<void_(const_helix::event_&)> *)local_58.price,__args);
    event::~event((event *)0x1412b2);
  }
  return;
}

Assistant:

void itch50_handler::process_msg(const itch50_order_executed* m)
{
    auto it = order_book_id_map.find(m->StockLocate);
    if (it != order_book_id_map.end()) {
        uint64_t quantity = be32toh(m->ExecutedShares);
        uint64_t timestamp = itch50_timestamp(m->Timestamp);
        auto& ob = it->second;
        auto result = ob.execute(m->OrderReferenceNumber, quantity);
        ob.set_timestamp(timestamp);
        trade t{timestamp, result.price, quantity, itch50_trade_sign(result.side)};
        _process_event(make_event(ob.symbol(), timestamp, &ob, &t, sweep_event(result)));
    }
}